

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::IFF_PDU::IFF_PDU(IFF_PDU *this,Header *H,KDataStream *stream)

{
  Header7::Header7(&this->super_Header,H);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__IFF_PDU_00334320;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EmittingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID);
  DATA_TYPE::Vector::Vector(&this->m_Location);
  DATA_TYPE::SystemIdentifier::SystemIdentifier(&this->m_SystemID);
  DATA_TYPE::FundamentalOperationalData::FundamentalOperationalData(&this->m_FOD);
  (this->m_vLayers).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vLayers).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vLayers).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

IFF_PDU::IFF_PDU(const Header &H, KDataStream &stream) noexcept(false) :
	Header( H )
{
    Decode( stream, true );
}